

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_future.cpp
# Opt level: O0

void __thiscall
Omega_h::Future<signed_char>::Future(Future<signed_char> *this,Read<signed_char> *buf)

{
  anon_class_16_1_ba1d39d3 local_b8;
  callback_type local_a8;
  vector<int,_std::allocator<int>_> local_88;
  Write<signed_char> local_60;
  undefined1 local_50 [24];
  Read<signed_char> *buf_local;
  Future<signed_char> *this_local;
  undefined8 local_28;
  Write<signed_char> *local_20;
  Write<signed_char> *local_18;
  Future<signed_char> *local_10;
  
  this_local = (Future<signed_char> *)local_50;
  local_50._0_8_ = (Alloc *)0x0;
  local_50._8_8_ = (void *)0x0;
  local_20 = &local_60;
  local_60.shared_alloc_.alloc = (Alloc *)0x0;
  local_60.shared_alloc_.direct_ptr = (void *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_50._16_8_ = buf;
  buf_local = &this->sendbuf_;
  local_28 = this_local;
  local_18 = local_20;
  local_10 = this_local;
  std::vector<int,_std::allocator<int>_>::vector(&local_88);
  Read<signed_char>::Read(&local_b8.buf,buf);
  std::function<Omega_h::Read<signed_char>(Omega_h::Write<signed_char>)>::
  function<Omega_h::Future<signed_char>::Future(Omega_h::Read<signed_char>)::_lambda(Omega_h::Write<signed_char>)_1_,void>
            ((function<Omega_h::Read<signed_char>(Omega_h::Write<signed_char>)> *)&local_a8,
             &local_b8);
  Future(this,(Read<signed_char> *)local_50,&local_60,&local_88,&local_a8);
  std::function<Omega_h::Read<signed_char>_(Omega_h::Write<signed_char>)>::~function(&local_a8);
  Future(Omega_h::Read<signed_char>)::{lambda(Omega_h::Write<signed_char>)#1}::~Write
            ((_lambda_Omega_h__Write<signed_char>__1_ *)&local_b8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_88);
  Write<signed_char>::~Write(&local_60);
  Read<signed_char>::~Read((Read<signed_char> *)local_50);
  this->status_ = completed;
  return;
}

Assistant:

Future<T>::Future(Read<T> buf)
    : Future({} /* sendbuf */, {} /* recvbuf */, {} /* request */,
          [buf](recvbuf_type) { return buf; }) {
  status_ = Status::completed;
}